

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O3

uint32_t __thiscall Shader::create_shader(Shader *this,char *source,uint32_t type)

{
  GLuint object;
  string *this_00;
  Shader *this_01;
  char *text_c;
  string text;
  GLchar *local_38;
  string local_30;
  
  this_00 = &local_30;
  load_file_abi_cxx11_(&local_30,source);
  local_38 = local_30._M_dataplus._M_p;
  fix_version((Shader *)this_00,&local_30);
  object = (*glad_glCreateShader)(type);
  (*glad_glShaderSource)(object,1,&local_38,(GLint *)0x0);
  this_01 = (Shader *)(ulong)object;
  (*glad_glCompileShader)(object);
  check_errors(this_01,object,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return object;
}

Assistant:

uint32_t Shader::create_shader(const char *source, uint32_t type)
{
    std::string text = load_file(source);
    const char* text_c = text.data();

    fix_version(text);

    GLuint shader = glCreateShader(type);
    glShaderSource(shader, 1, &text_c, nullptr);
    glCompileShader(shader);

    // Check any compilation errors
    check_errors(shader, COMPILE_ERRORS);

    return shader;
}